

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int cs_impl::conio::getch(void)

{
  int iVar1;
  int ch;
  int in_stack_00000074;
  
  terminal_lnbuf(in_stack_00000074);
  terminal_echo(in_stack_00000074);
  iVar1 = getchar();
  terminal_lnbuf(in_stack_00000074);
  terminal_echo(in_stack_00000074);
  return iVar1;
}

Assistant:

int getch()
		{
			terminal_lnbuf(0);
			terminal_echo(0);
			int ch = getchar();
			terminal_lnbuf(1);
			terminal_echo(1);
			return ch;
		}